

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageConvolution(gdImagePtr src,float (*filter) [3],float filter_div,float offset)

{
  int nc;
  gdImagePtr im;
  code *pcVar1;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  uint local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int yv;
  FuncPtr f;
  gdImagePtr srcback;
  int pxl;
  int new_pxl;
  float new_b;
  float new_g;
  float new_r;
  int new_a;
  int j;
  int i;
  int y;
  int x;
  float offset_local;
  float filter_div_local;
  float (*filter_local) [3];
  gdImagePtr src_local;
  
  srcback._0_4_ = 0;
  if (src == (gdImagePtr)0x0) {
    src_local._4_4_ = 0;
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
    if (im == (gdImagePtr)0x0) {
      src_local._4_4_ = 0;
    }
    else {
      gdImageSaveAlpha(im,1);
      nc = gdImageColorAllocateAlpha(im,0,0,0,0x7f);
      gdImageFill(im,0,0,nc);
      gdImageCopy(im,src,0,0,0,0,src->sx,src->sy);
      pcVar1 = gdImageGetPixel;
      if (src->trueColor != 0) {
        pcVar1 = gdImageGetTrueColorPixel;
      }
      for (j = 0; j < src->sy; j = j + 1) {
        for (i = 0; i < src->sx; i = i + 1) {
          pxl = 0;
          new_pxl = 0;
          new_b = 0.0;
          if (im->trueColor == 0) {
            local_68 = im->alpha[(int)(uint)srcback];
          }
          else {
            local_68 = (int)((uint)srcback & 0x7f000000) >> 0x18;
          }
          for (new_r = 0.0; (int)new_r < 3; new_r = (float)((int)new_r + 1)) {
            if (j + -1 + (int)new_r < 0) {
              local_6c = 0;
            }
            else {
              local_6c = j + -1 + (int)new_r;
            }
            if (local_6c < src->sy + -1) {
              if (j + -1 + (int)new_r < 0) {
                local_70 = 0;
              }
              else {
                local_70 = j + -1 + (int)new_r;
              }
              local_74 = local_70;
            }
            else {
              local_74 = src->sy + -1;
            }
            for (new_a = 0; new_a < 3; new_a = new_a + 1) {
              if (i + -1 + new_a < 0) {
                local_8c = 0;
              }
              else {
                local_8c = i + -1 + new_a;
              }
              if (local_8c < src->sx + -1) {
                if (i + -1 + new_a < 0) {
                  local_90 = 0;
                }
                else {
                  local_90 = i + -1 + new_a;
                }
                local_94 = local_90;
              }
              else {
                local_94 = src->sx + -1;
              }
              srcback._0_4_ = (*pcVar1)(im,local_94,local_74);
              if (im->trueColor == 0) {
                local_98 = im->red[(int)(uint)srcback];
              }
              else {
                local_98 = (int)((uint)srcback & 0xff0000) >> 0x10;
              }
              new_b = (float)local_98 * filter[(int)new_r][new_a] + new_b;
              if (im->trueColor == 0) {
                local_9c = im->green[(int)(uint)srcback];
              }
              else {
                local_9c = (int)((uint)srcback & 0xff00) >> 8;
              }
              new_pxl = (int)((float)local_9c * filter[(int)new_r][new_a] + (float)new_pxl);
              if (im->trueColor == 0) {
                local_a0 = im->blue[(int)(uint)srcback];
              }
              else {
                local_a0 = (uint)srcback & 0xff;
              }
              pxl = (int)((float)(int)local_a0 * filter[(int)new_r][new_a] + (float)pxl);
            }
          }
          local_a8 = new_b / filter_div + offset;
          local_b0 = (float)new_pxl / filter_div + offset;
          local_b8 = (float)pxl / filter_div + offset;
          if (local_a8 <= 255.0) {
            if (local_a8 < 0.0) {
              local_a8 = 0.0;
            }
            local_a4 = local_a8;
          }
          else {
            local_a4 = 255.0;
          }
          if (local_b0 <= 255.0) {
            if (local_b0 < 0.0) {
              local_b0 = 0.0;
            }
            local_ac = local_b0;
          }
          else {
            local_ac = 255.0;
          }
          if (local_b8 <= 255.0) {
            if (local_b8 < 0.0) {
              local_b8 = 0.0;
            }
            local_b4 = local_b8;
          }
          else {
            local_b4 = 255.0;
          }
          srcback._4_4_ =
               gdImageColorAllocateAlpha(src,(int)local_a4,(int)local_ac,(int)local_b4,local_68);
          if (srcback._4_4_ == -1) {
            srcback._4_4_ =
                 gdImageColorClosestAlpha(src,(int)local_a4,(int)local_ac,(int)local_b4,local_68);
          }
          gdImageSetPixel(src,i,j,srcback._4_4_);
        }
      }
      gdImageDestroy(im);
      src_local._4_4_ = 1;
    }
  }
  return src_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageConvolution(gdImagePtr src, float filter[3][3], float filter_div, float offset)
{
	int         x, y, i, j, new_a;
	float       new_r, new_g, new_b;
	int         new_pxl, pxl=0;
	gdImagePtr  srcback;
	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	/* We need the orinal image with each safe neoghb. pixel */
	srcback = gdImageCreateTrueColor (src->sx, src->sy);
	if (srcback==NULL) {
		return 0;
	}

	gdImageSaveAlpha(srcback, 1);
	new_pxl = gdImageColorAllocateAlpha(srcback, 0, 0, 0, 127);
	gdImageFill(srcback, 0, 0, new_pxl);

	gdImageCopy(srcback, src,0,0,0,0,src->sx,src->sy);

	f = GET_PIXEL_FUNCTION(src);

	for ( y=0; y<src->sy; y++) {
		for(x=0; x<src->sx; x++) {
			new_r = new_g = new_b = 0;
			new_a = gdImageAlpha(srcback, pxl);

			for (j=0; j<3; j++) {
				int yv = MIN(MAX(y - 1 + j, 0), src->sy - 1);
				for (i=0; i<3; i++) {
				        pxl = f(srcback, MIN(MAX(x - 1 + i, 0), src->sx - 1), yv);
					new_r += (float)gdImageRed(srcback, pxl) * filter[j][i];
					new_g += (float)gdImageGreen(srcback, pxl) * filter[j][i];
					new_b += (float)gdImageBlue(srcback, pxl) * filter[j][i];
				}
			}

			new_r = (new_r/filter_div)+offset;
			new_g = (new_g/filter_div)+offset;
			new_b = (new_b/filter_div)+offset;

			new_r = (new_r > 255.0f)? 255.0f : ((new_r < 0.0f)? 0.0f:new_r);
			new_g = (new_g > 255.0f)? 255.0f : ((new_g < 0.0f)? 0.0f:new_g);
			new_b = (new_b > 255.0f)? 255.0f : ((new_b < 0.0f)? 0.0f:new_b);

			new_pxl = gdImageColorAllocateAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)new_r, (int)new_g, (int)new_b, new_a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	gdImageDestroy(srcback);
	return 1;
}